

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O0

void nestl::test::detail::
     print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,char_const*,char_const*,nestl::has_exceptions::exception_ptr_error>,0ul,1ul,2ul,3ul>
               (ostream *os,
               tuple<const_char_*,_const_char_*,_const_char_*,_nestl::has_exceptions::exception_ptr_error>
               *t)

{
  __tuple_element_t<0UL,_tuple<const_char_*,_const_char_*,_const_char_*,_exception_ptr_error>_>
  *ppcVar1;
  __tuple_element_t<1UL,_tuple<const_char_*,_const_char_*,_const_char_*,_exception_ptr_error>_>
  *ppcVar2;
  __tuple_element_t<2UL,_tuple<const_char_*,_const_char_*,_const_char_*,_exception_ptr_error>_>
  *ppcVar3;
  __tuple_element_t<3UL,_tuple<const_char_*,_const_char_*,_const_char_*,_exception_ptr_error>_> *err
  ;
  tuple<const_char_*,_const_char_*,_const_char_*,_nestl::has_exceptions::exception_ptr_error>
  *t_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  ppcVar1 = std::
            get<0ul,char_const*,char_const*,char_const*,nestl::has_exceptions::exception_ptr_error>
                      (t);
  std::operator<<(os,*ppcVar1);
  ppcVar2 = std::
            get<1ul,char_const*,char_const*,char_const*,nestl::has_exceptions::exception_ptr_error>
                      (t);
  std::operator<<(os,*ppcVar2);
  ppcVar3 = std::
            get<2ul,char_const*,char_const*,char_const*,nestl::has_exceptions::exception_ptr_error>
                      (t);
  std::operator<<(os,*ppcVar3);
  err = std::get<3ul,char_const*,char_const*,char_const*,nestl::has_exceptions::exception_ptr_error>
                  (t);
  has_exceptions::operator<<(os,err);
  return;
}

Assistant:

void print_tuple_impl(std::basic_ostream<Ch, Tr>& os, const Tuple& t, seq<Is...>)
{
    using swallow = int[1 + sizeof...(Is)];
    (void)swallow
    {
        0,
        (void(os << /* (Is == 0 ? "" : ", ") << */ std::get<Is>(t)), 0)...
    };
}